

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O1

void pem_pbkdf1(uchar *key,size_t keylen,uchar *iv,uchar *pwd,size_t pwdlen)

{
  long lVar1;
  size_t __n;
  uchar md5sum [16];
  mbedtls_md5_context md5_ctx;
  undefined8 local_98;
  undefined8 uStack_90;
  mbedtls_md5_context local_88;
  
  mbedtls_md5_init(&local_88);
  mbedtls_md5_starts(&local_88);
  mbedtls_md5_update(&local_88,pwd,pwdlen);
  mbedtls_md5_update(&local_88,iv,8);
  mbedtls_md5_finish(&local_88,(uchar *)&local_98);
  if (keylen < 0x11) {
    memcpy(key,&local_98,keylen);
    mbedtls_md5_free(&local_88);
    lVar1 = 0;
    do {
      *(undefined1 *)((long)&local_98 + lVar1) = 0;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
  }
  else {
    *(undefined8 *)key = local_98;
    *(undefined8 *)(key + 8) = uStack_90;
    mbedtls_md5_starts(&local_88);
    mbedtls_md5_update(&local_88,(uchar *)&local_98,0x10);
    mbedtls_md5_update(&local_88,pwd,pwdlen);
    mbedtls_md5_update(&local_88,iv,8);
    mbedtls_md5_finish(&local_88,(uchar *)&local_98);
    __n = keylen - 0x10;
    if (0x1f < keylen) {
      __n = 0x10;
    }
    memcpy(key + 0x10,&local_98,__n);
    mbedtls_md5_free(&local_88);
    lVar1 = 0;
    do {
      *(undefined1 *)((long)&local_98 + lVar1) = 0;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
  }
  return;
}

Assistant:

static void pem_pbkdf1( unsigned char *key, size_t keylen,
                        unsigned char *iv,
                        const unsigned char *pwd, size_t pwdlen )
{
    mbedtls_md5_context md5_ctx;
    unsigned char md5sum[16];
    size_t use_len;

    mbedtls_md5_init( &md5_ctx );

    /*
     * key[ 0..15] = MD5(pwd || IV)
     */
    mbedtls_md5_starts( &md5_ctx );
    mbedtls_md5_update( &md5_ctx, pwd, pwdlen );
    mbedtls_md5_update( &md5_ctx, iv,  8 );
    mbedtls_md5_finish( &md5_ctx, md5sum );

    if( keylen <= 16 )
    {
        memcpy( key, md5sum, keylen );

        mbedtls_md5_free( &md5_ctx );
        mbedtls_zeroize( md5sum, 16 );
        return;
    }

    memcpy( key, md5sum, 16 );

    /*
     * key[16..23] = MD5(key[ 0..15] || pwd || IV])
     */
    mbedtls_md5_starts( &md5_ctx );
    mbedtls_md5_update( &md5_ctx, md5sum,  16 );
    mbedtls_md5_update( &md5_ctx, pwd, pwdlen );
    mbedtls_md5_update( &md5_ctx, iv,  8 );
    mbedtls_md5_finish( &md5_ctx, md5sum );

    use_len = 16;
    if( keylen < 32 )
        use_len = keylen - 16;

    memcpy( key + 16, md5sum, use_len );

    mbedtls_md5_free( &md5_ctx );
    mbedtls_zeroize( md5sum, 16 );
}